

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

bool __thiscall leveldb::Compaction::IsBaseLevelForKey(Compaction *this,Slice *user_key)

{
  long lVar1;
  Comparator *pCVar2;
  pointer ppFVar3;
  FileMetaData *pFVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  Slice local_50;
  Slice *local_40;
  _Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *local_38;
  
  lVar7 = (long)this->level_;
  bVar5 = 4 < lVar7;
  if (lVar7 < 5) {
    pCVar2 = (this->input_version_->vset_->icmp_).user_comparator_;
    lVar7 = lVar7 + 2;
    local_40 = user_key;
    do {
      local_38 = &this->input_version_->files_[lVar7].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      ;
      do {
        ppFVar3 = (local_38->_M_impl).super__Vector_impl_data._M_start;
        if ((ulong)((long)(local_38->_M_impl).super__Vector_impl_data._M_finish - (long)ppFVar3 >> 3
                   ) <= this->level_ptrs_[lVar7]) goto LAB_0011cf83;
        pFVar4 = ppFVar3[this->level_ptrs_[lVar7]];
        local_50 = InternalKey::user_key(&pFVar4->largest);
        iVar6 = (*pCVar2->_vptr_Comparator[2])(pCVar2,user_key,&local_50);
        if (iVar6 < 1) {
          local_50 = InternalKey::user_key(&pFVar4->smallest);
          iVar6 = (*pCVar2->_vptr_Comparator[2])(pCVar2,user_key,&local_50);
          iVar6 = (iVar6 >> 0x1f) * -5 + 1;
        }
        else {
          this->level_ptrs_[lVar7] = this->level_ptrs_[lVar7] + 1;
          iVar6 = 0;
        }
      } while (iVar6 == 0);
      if (iVar6 != 6) {
        return bVar5;
      }
LAB_0011cf83:
      lVar1 = lVar7 + 1;
      bVar5 = 5 < lVar7;
      lVar7 = lVar1;
    } while ((int)lVar1 != 7);
  }
  return bVar5;
}

Assistant:

bool Compaction::IsBaseLevelForKey(const Slice& user_key) {
  // Maybe use binary search to find right entry instead of linear search?
  const Comparator* user_cmp = input_version_->vset_->icmp_.user_comparator();
  for (int lvl = level_ + 2; lvl < config::kNumLevels; lvl++) {
    const std::vector<FileMetaData*>& files = input_version_->files_[lvl];
    while (level_ptrs_[lvl] < files.size()) {
      FileMetaData* f = files[level_ptrs_[lvl]];
      if (user_cmp->Compare(user_key, f->largest.user_key()) <= 0) {
        // We've advanced far enough
        if (user_cmp->Compare(user_key, f->smallest.user_key()) >= 0) {
          // Key falls in this file's range, so definitely not base level
          return false;
        }
        break;
      }
      level_ptrs_[lvl]++;
    }
  }
  return true;
}